

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O0

Atom_p __thiscall indigox::Molecule::NewAtom(Molecule *this,Element_p *e)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Atom_p AVar1;
  Atom_p *atm;
  Molecule *in_stack_00000068;
  element_type *this_00;
  
  this_00 = in_RDI;
  NewAtom(in_stack_00000068);
  std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1111ed);
  std::shared_ptr<indigox::Element>::shared_ptr
            ((shared_ptr<indigox::Element> *)this_00,(shared_ptr<indigox::Element> *)in_RDI);
  Atom::SetElement(this_00,(Element_p *)in_RDI);
  std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x111221);
  AVar1.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  AVar1.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Atom_p)AVar1.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Atom_p Molecule::NewAtom(Element_p e) {
  Atom_p atm = NewAtom();
  atm->SetElement(e);
  return atm;
}